

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_fire_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CHAR_DATA *victim;
  int iVar8;
  
  act("$n breathes forth a cone of fire.",ch,(void *)0x0,vo,1);
  act("$n breathes a cone of hot fire over you!",ch,(void *)0x0,vo,2);
  act("You breath forth a cone of fire.",ch,(void *)0x0,(void *)0x0,3);
  iVar8 = ch->hit;
  iVar4 = dice(level,5);
  iVar4 = iVar4 + iVar8 / 9;
  if (ch->hit <= iVar4) {
    iVar4 = ch->hit;
  }
  number_range(iVar8 / 0x51 + 1,iVar8 / 0x2d);
  iVar8 = iVar4 / 2;
  fire_effect(*(void **)((long)vo + 0xa8),level,iVar8,2);
  victim = *(CHAR_DATA **)(*(long *)((long)vo + 0xa8) + 0x18);
  if (victim != (CHAR_DATA *)0x0) {
    iVar2 = iVar4 + 7;
    iVar7 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar2 = iVar4;
      iVar7 = iVar4;
    }
    iVar7 = iVar7 >> 2;
    iVar5 = level + 3;
    if (-1 < level) {
      iVar5 = level;
    }
    do {
      pCVar1 = victim->next_in_room;
      bVar3 = is_safe(ch,victim);
      if ((((!bVar3) || (victim->fighting == (CHAR_DATA *)0x0 || victim->fighting == ch)) &&
          (bVar3 = is_same_group(victim,ch), !bVar3)) && (bVar3 = is_immortal(victim), !bVar3)) {
        iVar6 = iVar8;
        if (victim == (CHAR_DATA *)vo) {
          bVar3 = saves_spell(level,victim,4);
          if (bVar3) {
            fire_effect(victim,level / 2,iVar7,0);
          }
          else {
            fire_effect(victim,level,iVar4,0);
            iVar6 = iVar4;
          }
        }
        else {
          bVar3 = saves_spell(level + -2,victim,4);
          if (bVar3) {
            fire_effect(victim,iVar5 >> 2,iVar2 >> 3,0);
            iVar6 = iVar7;
          }
          else {
            fire_effect(victim,level / 2,iVar7,0);
          }
        }
        damage_old(ch,victim,iVar6,sn,4,true);
      }
      victim = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_fire_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	CHAR_DATA *vch, *vch_next;
	int dam, hp_dam, dice_dam;
	int hpch;

	act("$n breathes forth a cone of fire.", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a cone of hot fire over you!", ch, nullptr, victim, TO_VICT);
	act("You breath forth a cone of fire.", ch, nullptr, nullptr, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = number_range(hpch / 9 + 1, hpch / 5);

	/*
	dice_dam = dice(level,20);

	dam = std::max(hp_dam + dice_dam /10, dice_dam + hp_dam / 10);
	*/

	fire_effect(victim->in_room, level, dam / 2, TARGET_ROOM);

	for (vch = victim->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;
		/*
		if (is_safe_spell(ch,vch,true)
			|| (is_npc(vch) && is_npc(ch) && (ch->fighting != vch || vch->fighting != ch)))
		{
			continue;
		}
		*/

		if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
			continue;

		if (is_same_group(vch, ch))
			continue;

		if (is_immortal(vch))
			continue;

		if (vch == victim) /* full damage */
		{
			if (saves_spell(level, vch, DAM_FIRE))
			{
				fire_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_FIRE, true);
			}
			else
			{
				fire_effect(vch, level, dam, TARGET_CHAR);
				damage_old(ch, vch, dam, sn, DAM_FIRE, true);
			}
		}
		else /* partial damage */
		{
			if (saves_spell(level - 2, vch, DAM_FIRE))
			{
				fire_effect(vch, level / 4, dam / 8, TARGET_CHAR);
				damage_old(ch, vch, dam / 4, sn, DAM_FIRE, true);
			}
			else
			{
				fire_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_FIRE, true);
			}
		}
	}
}